

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

void Ivy_TruthDsdComputePrint(uint uTruth)

{
  int iVar1;
  
  if (Ivy_TruthDsdComputePrint::vTree == (Vec_Int_t *)0x0) {
    Ivy_TruthDsdComputePrint::vTree = Vec_IntAlloc(uTruth);
  }
  iVar1 = Ivy_TruthDsd(uTruth,Ivy_TruthDsdComputePrint::vTree);
  if (iVar1 != 0) {
    Ivy_TruthDsdPrint(_stdout,Ivy_TruthDsdComputePrint::vTree);
    return;
  }
  puts("Undecomposable");
  return;
}

Assistant:

void Ivy_TruthDsdComputePrint( unsigned uTruth )
{
    static Vec_Int_t * vTree = NULL;
    if ( vTree == NULL )
        vTree = Vec_IntAlloc( 12 );
    if ( Ivy_TruthDsd( uTruth, vTree ) )
        Ivy_TruthDsdPrint( stdout, vTree );
    else
        printf( "Undecomposable\n" );
}